

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O2

int64_t primesum::pi_lmo2(int64_t x)

{
  int iVar1;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  long lVar6;
  int64_t k;
  ulong uVar7;
  int64_t m;
  int128_t *__return_storage_ptr__;
  int128_t *piVar8;
  int64_t iVar9;
  long lVar10;
  size_type __n;
  double dVar11;
  int64_t k_1;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  int256_t phi;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  int256_t s1;
  int256_t local_98;
  int256_t local_78;
  int256_t p2;
  
  if (x < 2) {
    iVar9 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffec0;
    x_00._0_8_ = in_stack_fffffffffffffeb8;
    dVar15 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    lVar2 = iroot<3,long>(x);
    __return_storage_ptr__ = (int128_t *)(long)((double)lVar2 * dVar15);
    if ((long)__return_storage_ptr__ < 0xd) {
      lVar2 = (long)*(int *)(PhiTiny::pi + (long)__return_storage_ptr__ * 4);
    }
    else {
      lVar2 = 6;
    }
    x_01._8_8_ = dVar15;
    x_01._0_8_ = in_stack_fffffffffffffeb8;
    P2(&p2,(primesum *)x,(int128_t)x_01,0,(int)__return_storage_ptr__);
    generate_primes(&primes,(int64_t)__return_storage_ptr__);
    generate_lpf(&lpf,(int64_t)__return_storage_ptr__);
    generate_moebius(&mu,(int64_t)__return_storage_ptr__);
    x_02._8_8_ = dVar15;
    x_02._0_8_ = in_stack_fffffffffffffeb8;
    S1(&s1,(primesum *)x,(int128_t)x_02,0,(int64_t)__return_storage_ptr__,(int)lVar2);
    lVar3 = x / (long)__return_storage_ptr__;
    lVar4 = pi_bsearch<int,long>(&primes,(long)__return_storage_ptr__);
    __n = lVar3 + 1;
    local_78.low._0_1_ = 1;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&phi,__n,(value_type *)&local_78,
               (allocator_type *)&local_98);
    lVar10 = 0;
    if (0 < lVar2) {
      lVar10 = lVar2;
    }
    for (dVar5 = 4.94065645841247e-324; dVar5 != (double)(lVar10 + 1);
        dVar5 = (double)((long)dVar5 + 1)) {
      iVar1 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[(long)dVar5];
      for (lVar2 = (long)iVar1; lVar2 <= lVar3; lVar2 = lVar2 + iVar1) {
        *(undefined1 *)((size_type)phi.low + lVar2) = 0;
        __n = (size_type)phi.low;
      }
    }
    uVar13 = 0;
    dVar5 = (double)(lVar10 + 1);
    while (dVar11 = dVar5, (long)dVar11 < lVar4) {
      lVar12 = (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar11];
      lVar2 = 1;
      lVar10 = 0;
      for (piVar8 = __return_storage_ptr__; (long)__return_storage_ptr__ / lVar12 < (long)piVar8;
          piVar8 = (int128_t *)((long)piVar8 + -1)) {
        if (((long)mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(long)piVar8] != 0) &&
           (primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)dVar11] <
            lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)piVar8])) {
          lVar6 = x / ((long)piVar8 * lVar12) + 1;
          if (lVar6 < lVar2) {
            lVar6 = lVar2;
          }
          for (; lVar6 != lVar2; lVar2 = lVar2 + 1) {
            lVar10 = lVar10 + *(char *)((size_type)phi.low + lVar2) * lVar2;
          }
          __n = (long)piVar8 * lVar12 *
                (long)mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar8] * lVar10;
          uVar13 = uVar13 - __n;
          lVar2 = lVar6;
        }
      }
      lVar2 = lVar12 * 2;
      for (; lVar12 <= lVar3; lVar12 = lVar12 + lVar2) {
        *(undefined1 *)((size_type)phi.low + lVar12) = 0;
      }
      dVar15 = dVar11;
      dVar5 = (double)((long)dVar11 + 1);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&phi);
    uVar7 = (long)uVar13 >> 0x3f;
    phi.high._0_8_ = (ulong)s1.high + uVar7;
    phi.high._8_8_ = s1.high._8_8_ + uVar7 + (ulong)CARRY8((ulong)s1.high,uVar7);
    phi.low._0_8_ = uVar13 + (ulong)s1.low;
    phi.low._8_8_ = uVar7 + s1.low._8_8_ + (ulong)CARRY8(uVar13,(ulong)s1.low);
    if (CARRY8(uVar7,s1.low._8_8_) ||
        CARRY8(uVar7 + s1.low._8_8_,(ulong)CARRY8(uVar13,(ulong)s1.low))) {
      bVar14 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar14;
    }
    prime_sum_tiny(__return_storage_ptr__,__n);
    x_03._8_8_ = dVar15;
    x_03._0_8_ = in_stack_fffffffffffffeb8;
    int256_t::operator+(&local_98,&phi,(__int128)x_03);
    int256_t::operator-(&local_78,&local_98,1);
    iVar9 = CONCAT71(local_78.low._1_7_,(undefined1)local_78.low) - (long)p2.low;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar9;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}